

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O2

void QJsonPrivate::Writer::arrayToJson
               (QCborContainerPrivate *a,QByteArray *json,int indent,bool compact)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (a == (QCborContainerPrivate *)0x0) {
    lVar1 = 0x10;
  }
  else {
    lVar1 = (long)(int)(a->elements).d.size;
  }
  QByteArray::reserve(json,lVar1 + (json->d).size);
  pcVar2 = "[\n";
  if (compact) {
    pcVar2 = "[";
  }
  QByteArray::append(json,pcVar2);
  arrayContentToJson(a,json,(uint)!compact + indent,compact);
  QByteArray::QByteArray((QByteArray *)&local_40,(long)(indent << 2),' ');
  QByteArray::append(json,(QByteArray *)&local_40);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  pcVar2 = "]\n";
  if (compact) {
    pcVar2 = "]";
  }
  QByteArray::append(json,pcVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Writer::arrayToJson(const QCborContainerPrivate *a, QByteArray &json, int indent, bool compact)
{
    json.reserve(json.size() + (a ? (int)a->elements.size() : 16));
    json += compact ? "[" : "[\n";
    arrayContentToJson(a, json, indent + (compact ? 0 : 1), compact);
    json += QByteArray(4*indent, ' ');
    json += compact ? "]" : "]\n";
}